

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer_tests.cc
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
lf::io::test::
MeshFunctionLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/test/vtk_writer_tests.cc:218:37)>
::operator()(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
            MeshFunctionLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_io_test_vtk_writer_tests_cc:218:37)>
            *this,Entity *e,MatrixXd *x)

{
  GmshReader *pGVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  long i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_68;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_80,
             (x->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols,
             (allocator_type *)&local_68);
  if (0 < (x->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols) {
    i = 0;
    do {
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                (&local_68,x,i);
      pGVar1 = (this->f_).reader;
      peVar2 = (pGVar1->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      this_00 = (pGVar1->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      iVar3 = (*peVar2->_vptr_Mesh[5])(peVar2,e);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      *(int *)((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                       local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                      _M_start + i * 4) = iVar3;
      i = i + 1;
    } while (i < (x->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_cols);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
}

Assistant:

auto operator()(const mesh::Entity& e, const Eigen::MatrixXd& x) const {
    std::vector<std::invoke_result_t<F, const mesh::Entity&, Eigen::Matrix2d>>
        result(x.cols());
    for (int i = 0; i < x.cols(); ++i) {
      result[i] = f_(e, x.col(i));
    }
    return result;
  }